

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntTwoMerge2(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int *piVar1;
  int *piVar2;
  int *__ptr;
  int *piVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  int *piVar8;
  
  iVar4 = vArr1->nSize;
  iVar7 = vArr2->nSize;
  iVar5 = iVar7 + iVar4;
  __ptr = vArr->pArray;
  if (vArr->nCap < iVar5) {
    if (__ptr == (int *)0x0) {
      __ptr = (int *)malloc((long)iVar5 << 2);
    }
    else {
      __ptr = (int *)realloc(__ptr,(long)iVar5 << 2);
    }
    vArr->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vArr->nCap = iVar5;
    iVar4 = vArr1->nSize;
    iVar7 = vArr2->nSize;
  }
  piVar8 = vArr1->pArray;
  piVar3 = vArr2->pArray;
  piVar1 = piVar8 + iVar4;
  piVar2 = piVar3 + iVar7;
  piVar6 = __ptr;
  if (0 < iVar7 && 0 < iVar4) {
    do {
      iVar5 = *piVar8;
      iVar4 = *piVar3;
      if (iVar5 == iVar4) {
        piVar8 = piVar8 + 1;
        *piVar6 = iVar5;
        piVar3 = piVar3 + 1;
      }
      else if (iVar5 < iVar4) {
        piVar8 = piVar8 + 1;
        *piVar6 = iVar5;
      }
      else {
        piVar3 = piVar3 + 1;
        *piVar6 = iVar4;
      }
      piVar6 = piVar6 + 1;
    } while ((piVar8 < piVar1) && (piVar3 < piVar2));
  }
  for (; piVar8 < piVar1; piVar8 = piVar8 + 1) {
    *piVar6 = *piVar8;
    piVar6 = piVar6 + 1;
  }
  for (; piVar3 < piVar2; piVar3 = piVar3 + 1) {
    *piVar6 = *piVar3;
    piVar6 = piVar6 + 1;
  }
  iVar5 = (int)((ulong)((long)piVar6 - (long)__ptr) >> 2);
  vArr->nSize = iVar5;
  if (iVar5 <= vArr->nCap) {
    if (iVar5 < vArr1->nSize) {
      __assert_fail("vArr->nSize >= vArr1->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (iVar5 < vArr2->nSize) {
      __assert_fail("vArr->nSize >= vArr2->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    return;
  }
  __assert_fail("vArr->nSize <= vArr->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

static inline void Vec_IntTwoMerge2( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    Vec_IntGrow( vArr, Vec_IntSize(vArr1) + Vec_IntSize(vArr2) );
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
}